

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O3

int decode_nvrm_ioctl(uint32_t fd,uint32_t id,uint8_t dir,uint8_t nr,uint16_t size,mmt_buf *buf,
                     uint64_t ret,uint64_t err,void *state,mmt_memory_dump *args,int argc,char *name
                     )

{
  undefined8 uVar1;
  code *pcVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  int *piVar3;
  long lVar4;
  undefined6 in_register_00000082;
  
  piVar3 = (int *)CONCAT71(in_register_00000011,dir);
  if (0 < (long)nvrm_ioctls_cnt) {
    lVar4 = 0;
    do {
      if (*(uint32_t *)((long)&nvrm_ioctls[0].id + lVar4) == id) {
        if (*(int *)((long)&nvrm_ioctls[0].size + lVar4) != *piVar3) {
          return 1;
        }
        if (dump_decoded_ioctl_data != 0) {
          if (*(int *)((long)&nvrm_ioctls[0].disabled + lVar4) == 0) {
            uVar1 = *(undefined8 *)((long)&nvrm_ioctls[0].name + lVar4);
            if (indent_logs == 0) {
              fprintf(_stdout,"LOG: %-26s %-5s fd: %d, ",uVar1,err,(ulong)fd);
            }
            else {
              fprintf(_stdout,"%64s%-26s %-5s fd: %d, "," ",uVar1,err,(ulong)fd);
            }
            if (CONCAT71(in_register_00000009,nr) != 0) {
              fprintf(_stdout,"ret: %ld, ",CONCAT71(in_register_00000009,nr));
            }
            if (CONCAT62(in_register_00000082,size) != 0) {
              fprintf(_stdout,"%serr: %ld%s, ",colors->err,CONCAT62(in_register_00000082,size),
                      colors->reset);
            }
            nvrm_pfx = "";
            pcVar2 = *(code **)((long)&nvrm_ioctls[0].fun + lVar4);
            if (pcVar2 != (code *)0x0) {
              (*pcVar2)(piVar3 + 1);
            }
            pcVar2 = *(code **)((long)&nvrm_ioctls[0].fun_with_args + lVar4);
            if (pcVar2 == (code *)0x0) {
              if (dump_decoded_ioctl_data != 0) goto LAB_00259af2;
            }
            else {
              (*pcVar2)(piVar3 + 1,buf,ret & 0xffffffff);
            }
          }
          else {
LAB_00259af2:
            if (*(int *)((long)&nvrm_ioctls[0].disabled + lVar4) == 0) goto LAB_00259be4;
          }
        }
        if (dump_raw_ioctl_data == 0) {
          return 0;
        }
LAB_00259be4:
        dump_args((mmt_memory_dump *)buf,(int)ret,0);
        return 0;
      }
      lVar4 = lVar4 + 0x30;
    } while ((long)nvrm_ioctls_cnt * 0x30 != lVar4);
  }
  return 1;
}

Assistant:

static int decode_nvrm_ioctl(uint32_t fd, uint32_t id, uint8_t dir, uint8_t nr,
		uint16_t size, struct mmt_buf *buf, uint64_t ret, uint64_t err,
		void *state, struct mmt_memory_dump *args, int argc, const char *name)
{
	int k, found = 0;
	int args_used = 0;
	void (*fun)(void *) = NULL;
	void (*fun_with_args)(void *, struct mmt_memory_dump *, int argc) = NULL;

	struct nvrm_ioctl *ioctl;
	for (k = 0; k < nvrm_ioctls_cnt; ++k)
	{
		ioctl = &nvrm_ioctls[k];
		if (ioctl->id == id)
		{
			if (ioctl->size == buf->len)
			{
				if (dump_decoded_ioctl_data && !ioctl->disabled)
				{
					mmt_log("%-26s %-5s fd: %d, ", ioctl->name, name, fd);
					if (ret)
						mmt_log_cont("ret: %" PRId64 ", ", ret);
					if (err)
						mmt_log_cont("%serr: %" PRId64 "%s, ", colors->err, err, colors->reset);

					nvrm_reset_pfx();
					fun = ioctl->fun;
					if (fun)
						fun(buf->data);
					fun_with_args = ioctl->fun_with_args;
					if (fun_with_args)
					{
						fun_with_args(buf->data, args, argc);
						args_used = 1;
					}
				}
				found = 1;
			}
			break;
		}
	}

	if (!found)
		return 1;

	if ((!args_used && dump_decoded_ioctl_data && !ioctl->disabled) || dump_raw_ioctl_data)
		dump_args(args, argc, 0);

	return 0;
}